

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::~DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this)

{
  ~DecodeRawTransactionResponse(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~DecodeRawTransactionResponse() {
    // do nothing
  }